

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (end <= ptr) {
    return -4;
  }
  pcVar3 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    *nextTokPtr = ptr;
    return 0;
  case 2:
    iVar1 = normal_scanLt(enc,ptr + 1,end,nextTokPtr);
    return iVar1;
  case 3:
    iVar1 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar1;
  case 4:
    end_local = ptr + 1;
    if ((long)end - (long)end_local < 1) {
      return -5;
    }
    if (*end_local == ']') {
      pcVar2 = ptr + 2;
      if ((long)end - (long)pcVar2 < 1) {
        return -5;
      }
      if (*pcVar2 == '>') {
        *nextTokPtr = pcVar2;
        return 0;
      }
      end_local = ptr + 1;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar1 = (*enc[3].nameLength)(enc,ptr);
    if (iVar1 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar3 = extraout_RDX;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar3 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar3 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar3 = extraout_RDX_00;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar1 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)ptr);
    if (iVar1 != 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar3 = extraout_RDX_01;
    break;
  case 9:
    end_local = ptr + 1;
    if ((long)end - (long)end_local < 1) {
      return -3;
    }
    if (*(char *)((long)enc[1].scanners + (ulong)(byte)*end_local) == '\n') {
      end_local = ptr + 2;
    }
    *nextTokPtr = end_local;
    return 7;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    end_local = ptr + 1;
  }
LAB_00b0e7f7:
  do {
    if ((long)end - (long)end_local < 1) {
      *nextTokPtr = end_local;
      return 6;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 4:
      if (1 < (long)end - (long)end_local) {
        if (end_local[1] != ']') {
          end_local = end_local + 1;
          break;
        }
        if (2 < (long)end - (long)end_local) {
          if (end_local[2] == '>') {
            *nextTokPtr = end_local + 2;
            return 0;
          }
          end_local = end_local + 1;
          break;
        }
      }
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      *nextTokPtr = end_local;
      return 6;
    case 5:
      if (((long)end - (long)end_local < 2) ||
         (iVar1 = (*enc[3].nameLength)(enc,end_local), iVar1 != 0)) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 2;
      pcVar3 = extraout_RDX_02;
      break;
    case 6:
      if (((long)end - (long)end_local < 3) ||
         (pcVar3 = (*enc[3].skipS)(enc,end_local), (int)pcVar3 != 0)) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 3;
      pcVar3 = extraout_RDX_03;
      break;
    case 7:
      if (((long)end - (long)end_local < 4) ||
         (iVar1 = (*enc[3].getAtts)(enc,end_local,(int)pcVar3,(ATTRIBUTE *)end_local), iVar1 != 0))
      {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 4;
      pcVar3 = extraout_RDX_04;
      break;
    default:
      goto switchD_00b0e83f_default;
    }
  } while( true );
switchD_00b0e83f_default:
  end_local = end_local + 1;
  goto LAB_00b0e7f7;
}

Assistant:

static int PTRCALL
PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return XML_TOK_TRAILING_RSQB;
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_RSQB:
      if (HAS_CHARS(enc, ptr, end, 2)) {
        if (! CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
          ptr += MINBPC(enc);
          break;
        }
        if (HAS_CHARS(enc, ptr, end, 3)) {
          if (! CHAR_MATCHES(enc, ptr + 2 * MINBPC(enc), ASCII_GT)) {
            ptr += MINBPC(enc);
            break;
          }
          *nextTokPtr = ptr + 2 * MINBPC(enc);
          return XML_TOK_INVALID;
        }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}